

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O2

void __thiscall cppnet::RWSocket::Connect(RWSocket *this,string *ip,uint16_t port)

{
  uint64_t *__k;
  Address *this_00;
  bool ipv4;
  Event *pEVar1;
  __shared_ptr<cppnet::Socket,(__gnu_cxx::_Lock_policy)2> *this_01;
  SingletonLogger *this_02;
  long *in_FS_OFFSET;
  SysCallInt64Result SVar2;
  shared_ptr<cppnet::EventActions> actions;
  __shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2> local_48;
  
  if (this->_event == (Event *)0x0) {
    pEVar1 = AlloterWrap::PoolNew<cppnet::Event>
                       ((this->_alloter).
                        super___shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    this->_event = pEVar1;
    std::__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<cppnet::RWSocket,void>
              ((__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2> *)&actions,
               (__weak_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<cppnet::RWSocket>);
    local_48._M_ptr =
         (element_type *)
         actions.super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_48._M_refcount._M_pi =
         actions.super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    actions.super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    actions.super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__weak_ptr<cppnet::Socket,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__weak_ptr<cppnet::Socket,(__gnu_cxx::_Lock_policy)2> *)&pEVar1->_socket,&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&actions.super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  ipv4 = Address::IsIpv4(ip);
  __k = &(this->super_Socket)._sock;
  if ((this->super_Socket)._sock == 0) {
    SVar2 = OsHandle::TcpSocket(ipv4);
    if (SVar2._return_value < 0) {
      this_02 = Singleton<cppnet::SingletonLogger>::Instance();
      SingletonLogger::Error
                (this_02,
                 "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/socket/rw_socket.cpp"
                 ,0x84,"create socket failed. error:%d",(ulong)(uint)SVar2._errno);
      return;
    }
    *__k = SVar2._return_value;
  }
  this_00 = &(this->super_Socket)._addr;
  (this->super_Socket)._addr._address_type = AT_IPV6 - ipv4;
  Address::SetIp(this_00,ip);
  (this->super_Socket)._addr._port = port;
  std::__shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&actions.super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>,
             &(this->super_Socket)._event_actions);
  if (actions.super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    LOCK();
    (this->_connecting)._M_base._M_i = true;
    UNLOCK();
    std::__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<cppnet::RWSocket,void>
              ((__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2> *)&local_58,
               (__weak_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<cppnet::RWSocket>);
    __connecting_socket_map::__tls_init();
    this_01 = (__shared_ptr<cppnet::Socket,(__gnu_cxx::_Lock_policy)2> *)
              std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)(*in_FS_OFFSET + -0x80),__k);
    std::__shared_ptr<cppnet::Socket,(__gnu_cxx::_Lock_policy)2>::operator=(this_01,&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    (*(actions.super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_EventActions[7])
              (actions.super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               this->_event,this_00);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&actions.super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void RWSocket::Connect(const std::string& ip, uint16_t port) {
    if (!_event) {
        _event = _alloter->PoolNew<Event>();
        _event->SetSocket(shared_from_this());
    }

    bool use_ipv4 = false;
    if (Address::IsIpv4(ip)) {
        use_ipv4 = true;
    }
    if (_sock == 0) {
        auto ret = OsHandle::TcpSocket(use_ipv4);
        if (ret._return_value < 0) {
            LOG_ERROR("create socket failed. error:%d", ret._errno);
            return;
        }
        _sock = ret._return_value;
    }

    _addr.SetType(use_ipv4 ? AT_IPV4 : AT_IPV6);
    _addr.SetIp(ip);
    _addr.SetAddrPort(port);

    auto actions = GetEventActions();
    if (actions) {
        _connecting = true;
        __connecting_socket_map[_sock] = shared_from_this();
        actions->AddConnection(_event, _addr);
    }
}